

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<StrictMockProblemBuilder_&()>::ShouldHandleArguments
          (TypedExpectation<StrictMockProblemBuilder_&()> *this,ArgumentTuple *args)

{
  MatcherInterface<const_std::tuple<>_&> *pMVar1;
  bool bVar2;
  int iVar3;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (((this->super_ExpectationBase).retired_ == false) &&
     (bVar2 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase), bVar2)) {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    pMVar1 = (this->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.impl_.value_;
    iVar3 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar1,args);
    return (bool)(char)iVar3;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }